

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

Status __thiscall
google::protobuf::(anonymous_namespace)::Error<char_const*,google::protobuf::Edition,char_const*>
          (_anonymous_namespace_ *this,char *args,Edition args_1,char *args_2)

{
  AlphaNum *in_R8;
  string_view message;
  AlphaNum local_118;
  string local_d8;
  AlphaNum local_b8;
  AlphaNum local_88;
  string local_58;
  undefined1 local_38 [16];
  char *local_28;
  char *args_local_2;
  char *pcStack_18;
  Edition args_local_1;
  char *args_local;
  
  local_28 = args_2;
  args_local_2._4_4_ = args_1;
  pcStack_18 = args;
  args_local = (char *)this;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_88,args);
  local_d8.field_2._M_allocated_capacity = 0;
  local_d8.field_2._8_8_ = 0;
  local_d8._M_dataplus = (_Alloc_hider)0x0;
  local_d8._1_7_ = 0;
  local_d8._M_string_length = 0;
  absl::lts_20250127::strings_internal::StringifySink::StringifySink((StringifySink *)&local_d8);
  absl::lts_20250127::AlphaNum::AlphaNum<google::protobuf::Edition,void>
            (&local_b8,(Edition *)((long)&args_local_2 + 4),(StringifySink *)&local_d8);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_118,local_28);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_58,(lts_20250127 *)&local_88,&local_b8,&local_118,in_R8);
  local_38 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
  message._M_str = local_38._0_8_;
  message._M_len = (size_t)this;
  absl::lts_20250127::FailedPreconditionError(message);
  std::__cxx11::string::~string((string *)&local_58);
  absl::lts_20250127::strings_internal::StringifySink::~StringifySink((StringifySink *)&local_d8);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}